

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O1

void iutest::detail::printer_internal2::DefaultPrintNonContainerTo<iutest::detail::EqMatcher<int>>
               (EqMatcher<int> *value,iu_ostream *os)

{
  long *local_30;
  long local_28;
  long local_20 [2];
  
  (*(value->super_IMatcher)._vptr_IMatcher[2])(&local_30,value);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return;
}

Assistant:

void DefaultPrintNonContainerTo(const T& value, iu_ostream* os)
{
    using namespace ::iutest::detail::printer_internal; // NOLINT
    *os << value;
}